

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-rope.cpp
# Opt level: O2

int main(int param_1,char **param_2)

{
  float fVar1;
  float fVar2;
  long lVar3;
  long lVar4;
  char cVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  undefined8 uVar9;
  long lVar10;
  long lVar11;
  int64_t iVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  undefined4 in_register_0000003c;
  long lVar21;
  int iVar22;
  long lVar23;
  long lVar24;
  int i3;
  long lVar25;
  bool bVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  int64_t ne [4];
  undefined4 local_b8;
  char *local_a0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> work_buffer;
  int sections [4];
  
  work_buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  work_buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  work_buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar9 = ggml_init(CONCAT44(in_register_0000003c,param_1));
  local_a0 = "diff / sum0 < 0.0001f";
  uVar8 = 0;
  while( true ) {
    if (uVar8 == 5) {
      ggml_free(uVar9);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&work_buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      return 0;
    }
    ne[2] = 0x49;
    ne[3] = 1;
    ne[0]._0_4_ = 0x100;
    ne[0]._4_4_ = 0;
    ne[1]._0_4_ = 0x20;
    ne[1]._4_4_ = 0;
    lVar10 = ggml_new_tensor(uVar9,0,4,ne);
    for (lVar25 = 0; lVar25 < ne[3]; lVar25 = lVar25 + 1) {
      lVar11 = ne[2];
      for (lVar23 = 0; lVar23 < lVar11; lVar23 = lVar23 + 1) {
        lVar16 = CONCAT44(ne[1]._4_4_,(undefined4)ne[1]);
        for (lVar24 = 0; lVar24 < lVar16; lVar24 = lVar24 + 1) {
          lVar21 = CONCAT44(ne[0]._4_4_,(undefined4)ne[0]);
          for (lVar19 = 0; lVar19 < lVar21; lVar19 = lVar19 + 1) {
            iVar6 = rand();
            lVar21 = CONCAT44(ne[0]._4_4_,(undefined4)ne[0]);
            lVar16 = CONCAT44(ne[1]._4_4_,(undefined4)ne[1]);
            *(float *)(((lVar25 * ne[2] + lVar23) * lVar16 + lVar24) * lVar21 * 4 +
                       *(long *)(lVar10 + 0xf8) + lVar19 * 4) =
                 (float)iVar6 * 4.656613e-10 + (float)iVar6 * 4.656613e-10 + -1.0;
            lVar11 = ne[2];
          }
        }
      }
    }
    if (uVar8 < 3) {
      lVar25 = ggml_new_tensor_1d(uVar9,0x1a,ne[2]);
      lVar11 = ggml_new_tensor_1d(uVar9,0x1a,ne[2]);
      lVar23 = ggml_new_tensor_1d(uVar9,0x1a,ne[2]);
      iVar12 = ne[2];
      if (ne[2] < 1) {
        iVar12 = 0;
      }
      for (lVar16 = 0; iVar12 != lVar16; lVar16 = lVar16 + 1) {
        *(int *)(*(long *)(lVar25 + 0xf8) + lVar16 * 4) = (int)lVar16 + 100;
        *(undefined4 *)(*(long *)(lVar11 + 0xf8) + lVar16 * 4) = 0xffffffbd;
        *(int *)(*(long *)(lVar23 + 0xf8) + lVar16 * 4) = (int)lVar16 + 0x21;
      }
      cVar5 = (uVar8 != 1) * '\x02' + '\x02';
      if (uVar8 == 0) {
        cVar5 = '\0';
      }
      uVar13 = ggml_rope(uVar9,lVar10,lVar25,0x80,cVar5);
      lVar25 = ggml_rope(uVar9,uVar13,lVar11,0x80,cVar5);
      lVar10 = ggml_rope(uVar9,lVar10,lVar23,0x80,cVar5);
    }
    else {
      lVar11 = ggml_new_tensor_1d(uVar9,0x1a,ne[2] << 2);
      lVar23 = ggml_new_tensor_1d(uVar9,0x1a,ne[2] << 2);
      lVar16 = ggml_new_tensor_1d(uVar9,0x1a,ne[2] << 2);
      sections[0] = 0x10;
      sections[1] = 0x18;
      sections[2] = 0x18;
      sections[3] = 0;
      lVar25 = 0;
      if (0 < ne[2]) {
        lVar25 = ne[2];
      }
      iVar6 = 100;
      lVar24 = 0;
      for (lVar21 = 0; lVar21 != lVar25; lVar21 = lVar21 + 1) {
        lVar19 = *(long *)(lVar11 + 0xf8);
        lVar3 = *(long *)(lVar23 + 0xf8);
        lVar4 = *(long *)(lVar16 + 0xf8);
        lVar18 = 4;
        lVar20 = lVar24;
        iVar22 = iVar6;
        while (bVar26 = lVar18 != 0, lVar18 = lVar18 + -1, bVar26) {
          *(int *)(lVar19 + lVar20) = iVar22;
          *(undefined4 *)(lVar3 + lVar20) = 0xffffffbd;
          *(int *)(lVar4 + lVar20) = iVar22 + -0x43;
          lVar20 = lVar20 + ne[2] * 4;
          iVar22 = iVar22 + 1;
        }
        lVar24 = lVar24 + 4;
        iVar6 = iVar6 + 1;
      }
      uVar7 = (uint)(uVar8 != 3) << 4 | 8;
      uVar13 = ggml_rope_multi(0x49742400,0x3f800000,0,0x3f800000,0x42000000,0x3f800000,uVar9,lVar10
                               ,lVar11,0,0x80,sections,uVar7,0x8000);
      lVar25 = ggml_rope_multi(0x49742400,0x3f800000,0,0x3f800000,0x42000000,0x3f800000,uVar9,uVar13
                               ,lVar23,0,0x80,sections,uVar7,0x8000);
      lVar10 = ggml_rope_multi(0x49742400,0x3f800000,0,0x3f800000,uVar9,lVar10,lVar16,0,0x80,
                               sections,uVar7);
    }
    uVar14 = ggml_new_graph(uVar9);
    ggml_build_forward_expand(uVar14,uVar13);
    ggml_build_forward_expand(uVar14,lVar25);
    ggml_build_forward_expand(uVar14,lVar10);
    ggml_graph_plan(sections,uVar14,4,0);
    if (sections._0_8_ != 0) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                (&work_buffer,sections._0_8_);
      sections._8_8_ =
           work_buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
    }
    ggml_graph_compute(uVar14,sections);
    lVar11 = *(long *)(lVar25 + 0xf8);
    lVar10 = *(long *)(lVar10 + 0xf8);
    uVar7 = ggml_nelements(lVar25);
    uVar15 = (ulong)uVar7;
    if ((int)uVar7 < 1) {
      uVar15 = 0;
    }
    dVar28 = 0.0;
    dVar29 = 0.0;
    dVar27 = 0.0;
    for (uVar17 = 0; uVar15 != uVar17; uVar17 = uVar17 + 1) {
      fVar1 = *(float *)(lVar11 + uVar17 * 4);
      fVar2 = *(float *)(lVar10 + uVar17 * 4);
      dVar28 = dVar28 + (double)(float)((uint)fVar1 & (uint)DAT_00103020);
      dVar29 = dVar29 + (double)(float)((uint)fVar2 & DAT_00103020._4_4_);
      dVar27 = dVar27 + (double)(float)((uint)(fVar1 - fVar2) & (uint)DAT_00103020);
    }
    local_b8 = SUB84(dVar28,0);
    printf("mode: %d\n");
    printf("sum0: %f\n",local_b8);
    printf("sum1: %f\n");
    printf("diff: %f\n",SUB84(dVar27,0));
    printf("rel err: %f\n");
    printf("rel err: %f\n");
    if (9.999999747378752e-05 <= dVar27 / dVar28) break;
    if (9.999999747378752e-05 <= dVar27 / dVar29) {
      uVar9 = 0xff;
      local_a0 = "diff / sum1 < 0.0001f";
      goto LAB_0010289e;
    }
    uVar8 = uVar8 + 1;
  }
  uVar9 = 0xfe;
LAB_0010289e:
  uVar9 = ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/tests/test-rope.cpp"
                     ,uVar9,"GGML_ASSERT(%s) failed",local_a0);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&work_buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  _Unwind_Resume(uVar9);
}

Assistant:

int main(int /*argc*/, const char ** /*argv*/) {
    struct ggml_init_params params = {
        /* .mem_size   = */ 128*1024*1024,
        /* .mem_buffer = */ NULL,
        /* .no_alloc   = */ false,
    };

    std::vector<uint8_t> work_buffer;

    struct ggml_context * ctx0 = ggml_init(params);

    struct ggml_tensor * x;

    // rope f32
    for (int m = 0; m < 5; ++m) {
        const int ndims = 4;

        const int64_t n_rot = 128;
        const int64_t ne[4] = { 2*n_rot, 32, 73, 1 };

        const int n_past_0 = 100;
        const int n_past_2 = 33;

        struct ggml_tensor * r0;
        struct ggml_tensor * r1;
        struct ggml_tensor * r2;
        x = get_random_tensor_f32(ctx0, ndims, ne, -1.0f, 1.0f);
        int mode = -1;

        if (m < 3) {
            struct ggml_tensor * p0 = ggml_new_tensor_1d(ctx0, GGML_TYPE_I32, ne[2]);
            struct ggml_tensor * p1 = ggml_new_tensor_1d(ctx0, GGML_TYPE_I32, ne[2]);
            struct ggml_tensor * p2 = ggml_new_tensor_1d(ctx0, GGML_TYPE_I32, ne[2]);

            for (int i = 0; i < ne[2]; ++i) {
                ((int32_t *) p0->data)[i] = n_past_0 + i;
                ((int32_t *) p1->data)[i] = n_past_2 - n_past_0;
                ((int32_t *) p2->data)[i] = n_past_2 + i;
            }
            // test mode 0, 2, 4 (standard, GPT-NeoX, GLM)
            mode = m == 0 ? 0 : m == 1 ? 2 : 4;

            // 100, 101, 102, ..., 172
            r0 = ggml_rope(ctx0, x,  p0, n_rot, mode);
            // -67, -67, -67, ..., -67
            r1 = ggml_rope(ctx0, r0, p1, n_rot, mode); // "context swap", i.e. forget n_past_0 - n_past_2 tokens

            //  33,  34,  35, ..., 105
            r2 = ggml_rope(ctx0, x,  p2, n_rot, mode);
        } else {
            // testing multi-dimension rope position embedding mode
            struct ggml_tensor * p0 = ggml_new_tensor_1d(ctx0, GGML_TYPE_I32, ne[2] * 4);
            struct ggml_tensor * p1 = ggml_new_tensor_1d(ctx0, GGML_TYPE_I32, ne[2] * 4);
            struct ggml_tensor * p2 = ggml_new_tensor_1d(ctx0, GGML_TYPE_I32, ne[2] * 4);

            int sections[4] = {16, 24, 24, 0};
            mode = (m == 3) ? GGML_ROPE_TYPE_MROPE : GGML_ROPE_TYPE_VISION;

            for (int i = 0; i < ne[2]; ++i) {
                for (int j = 0; j < 4; ++j) {
                    ((int32_t *) p0->data)[i + ne[2] * j] = n_past_0 + i + j;
                    ((int32_t *) p1->data)[i + ne[2] * j] = n_past_2 - n_past_0;
                    ((int32_t *) p2->data)[i + ne[2] * j] = n_past_2 + i + j;
                }
            }

            // [[100, 101, 102, ..., 172],
            // [101, 102, 103, ..., 173],
            // [102, 103, 104, ..., 174]]
            r0 = ggml_rope_multi(
                ctx0, x, p0, nullptr,
                n_rot, sections, mode, 32768, 1000000, 1, 0, 1, 32, 1);
            // [[-67, -67, -67, ..., -67]
            // [-67, -67, -67, ..., -67]
            // [-67, -67, -67, ..., -67]]
            r1 = ggml_rope_multi(
                ctx0, r0, p1, nullptr,
                n_rot, sections, mode, 32768, 1000000, 1, 0, 1, 32, 1);

            //  [[33,  34,  35, ..., 105]
            //  [34,  35,  36, ..., 106]
            //  [35,  36,  37, ..., 107]]
            r2 = ggml_rope_multi(
                ctx0, x, p2, nullptr,
                n_rot, sections, mode, 32768, 1000000, 1, 0, 1, 32, 1);
        }

        ggml_cgraph * gf = ggml_new_graph(ctx0);

        ggml_build_forward_expand(gf, r0);
        ggml_build_forward_expand(gf, r1);
        ggml_build_forward_expand(gf, r2);

        ggml_graph_compute_helper(work_buffer, gf, 4);

        // check that r1 and r2 are the same
        {
            double sum0 = 0.0f;
            double sum1 = 0.0f;
            double diff = 0.0f;

            const float * r1_data = (float *) r1->data;
            const float * r2_data = (float *) r2->data;

            const int n_elements = ggml_nelements(r1);

            for (int i = 0; i < n_elements; ++i) {
                sum0 += fabs(r1_data[i]);
                sum1 += fabs(r2_data[i]);
                diff += fabs(r1_data[i] - r2_data[i]);
                //if (fabs(r1_data[i] - r2_data[i]) > 0.0001f) {
                //    printf("%d: %f %f\n", i, r1_data[i], r2_data[i]);
                //    printf("diff: %f\n", fabs(r1_data[i] - r2_data[i]));
                //}
            }

            //for (int i = 4096; i < 4096 + 128; ++i) {
            //    printf("%f %f\n", r1_data[i], r2_data[i]);
            //}

            printf("mode: %d\n", mode);
            printf("sum0: %f\n", sum0);
            printf("sum1: %f\n", sum1);
            printf("diff: %f\n", diff);
            printf("rel err: %f\n", diff / sum0);
            printf("rel err: %f\n", diff / sum1);

            GGML_ASSERT(diff / sum0 < 0.0001f);
            GGML_ASSERT(diff / sum1 < 0.0001f);
        }
    }

    ggml_free(ctx0);

    return 0;
}